

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::EndTestCase
          (BasicReporter *this,TestCaseInfo *testInfo,Totals *totals,string *stdOut,string *stdErr)

{
  ulong uVar1;
  ostream *poVar2;
  BasicReporter *in_RCX;
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000090;
  Totals *in_stack_00000098;
  BasicReporter *in_stack_000000a0;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [48];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  BasicReporter *in_stack_ffffffffffffffc0;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    startSpansLazily(in_RCX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,"stdout",(allocator *)&stack0xffffffffffffffb7);
    streamVariableLengthText
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    startSpansLazily(in_RCX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"stderr",&local_81);
    streamVariableLengthText
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  if ((*(byte *)(in_RDI + 0x98) & 1) != 0) {
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,"[Finished: \'");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::operator<<(poVar2,"\' ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"All ",&local_a9);
    ReportCounts(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

virtual void EndTestCase(   const TestCaseInfo& testInfo,
                                    const Totals& totals,
                                    const std::string& stdOut,
                                    const std::string& stdErr ) {
            if( !stdOut.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stdout", stdOut );
            }

            if( !stdErr.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stderr", stdErr );
            }

            if( m_testSpan.emitted ) {
                m_config.stream() << "[Finished: '" << testInfo.name << "' ";
                ReportCounts( totals );
                m_config.stream() << "]" << std::endl;
            }
        }